

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

ELzma2State Lzma2Dec_UpdateState(CLzma2Dec *p,Byte b)

{
  uint uVar1;
  ELzma2State local_2c;
  uint lp;
  uint lc;
  Byte b_local;
  CLzma2Dec *p_local;
  ELzma2State local_4;
  
  switch(p->state) {
  case 0:
    p->control = b;
    if (p->control == '\0') {
      local_4 = LZMA2_STATE_FINISHED;
    }
    else {
      if ((p->control & 0x80) == 0) {
        if (2 < (p->control & 0x7f)) {
          return LZMA2_STATE_ERROR;
        }
        p->unpackSize = 0;
      }
      else {
        p->unpackSize = (p->control & 0x1f) << 0x10;
      }
      local_4 = LZMA2_STATE_UNPACK0;
    }
    break;
  case 1:
    p->unpackSize = (uint)b << 8 | p->unpackSize;
    local_4 = LZMA2_STATE_UNPACK1;
    break;
  case 2:
    p->unpackSize = (uint)b | p->unpackSize;
    p->unpackSize = p->unpackSize + 1;
    local_4 = LZMA2_STATE_PACK0;
    if ((p->control & 0x80) == 0) {
      local_4 = LZMA2_STATE_DATA;
    }
    break;
  case 3:
    p->packSize = (uint)b << 8;
    local_4 = LZMA2_STATE_PACK1;
    break;
  case 4:
    p->packSize = (uint)b | p->packSize;
    p->packSize = p->packSize + 1;
    if (((int)(uint)p->control >> 5 & 3U) < 2) {
      local_2c = LZMA2_STATE_DATA;
      if (p->needInitProp != 0) {
        local_2c = LZMA2_STATE_ERROR;
      }
    }
    else {
      local_2c = LZMA2_STATE_PROP;
    }
    local_4 = local_2c;
    break;
  case 5:
    if (b < 0xe1) {
      (p->decoder).prop.pb = (b / 9) / 5;
      uVar1 = (uint)(b / 9) % 5;
      if ((uint)b % 9 + uVar1 < 5) {
        (p->decoder).prop.lc = (uint)b % 9;
        (p->decoder).prop.lp = uVar1;
        p->needInitProp = 0;
        local_4 = LZMA2_STATE_DATA;
      }
      else {
        local_4 = LZMA2_STATE_ERROR;
      }
    }
    else {
      local_4 = LZMA2_STATE_ERROR;
    }
    break;
  default:
    local_4 = LZMA2_STATE_ERROR;
  }
  return local_4;
}

Assistant:

static ELzma2State Lzma2Dec_UpdateState(CLzma2Dec *p, Byte b)
{
  switch (p->state)
  {
    case LZMA2_STATE_CONTROL:
      p->control = b;
      PRF(printf("\n %4X ", (unsigned)p->decoder.dicPos));
      PRF(printf(" %2X", (unsigned)b));
      if (p->control == 0)
        return LZMA2_STATE_FINISHED;
      if (LZMA2_IS_UNCOMPRESSED_STATE(p))
      {
        if ((p->control & 0x7F) > 2)
          return LZMA2_STATE_ERROR;
        p->unpackSize = 0;
      }
      else
        p->unpackSize = (UInt32)(p->control & 0x1F) << 16;
      return LZMA2_STATE_UNPACK0;
    
    case LZMA2_STATE_UNPACK0:
      p->unpackSize |= (UInt32)b << 8;
      return LZMA2_STATE_UNPACK1;
    
    case LZMA2_STATE_UNPACK1:
      p->unpackSize |= (UInt32)b;
      p->unpackSize++;
      PRF(printf(" %8u", (unsigned)p->unpackSize));
      return (LZMA2_IS_UNCOMPRESSED_STATE(p)) ? LZMA2_STATE_DATA : LZMA2_STATE_PACK0;
    
    case LZMA2_STATE_PACK0:
      p->packSize = (UInt32)b << 8;
      return LZMA2_STATE_PACK1;

    case LZMA2_STATE_PACK1:
      p->packSize |= (UInt32)b;
      p->packSize++;
      PRF(printf(" %8u", (unsigned)p->packSize));
      return LZMA2_IS_THERE_PROP(LZMA2_GET_LZMA_MODE(p)) ? LZMA2_STATE_PROP:
        (p->needInitProp ? LZMA2_STATE_ERROR : LZMA2_STATE_DATA);

    case LZMA2_STATE_PROP:
    {
      unsigned lc, lp;
      if (b >= (9 * 5 * 5))
        return LZMA2_STATE_ERROR;
      lc = b % 9;
      b /= 9;
      p->decoder.prop.pb = b / 5;
      lp = b % 5;
      if (lc + lp > LZMA2_LCLP_MAX)
        return LZMA2_STATE_ERROR;
      p->decoder.prop.lc = lc;
      p->decoder.prop.lp = lp;
      p->needInitProp = False;
      return LZMA2_STATE_DATA;
    }
  }
  return LZMA2_STATE_ERROR;
}